

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<TPZRestoredInstance>::Resize(TPZVec<TPZRestoredInstance> *this,int64_t newsize)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  int64_t *piVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  TPZRestoredInstance *pTVar7;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ostream::flush();
  }
  if (this->fNElements != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pTVar7 = this->fStore;
      if (pTVar7 != (TPZRestoredInstance *)0x0) {
        lVar4 = *(long *)&pTVar7[-1].is_already_read;
        if (lVar4 != 0) {
          lVar5 = lVar4 * 0x60;
          do {
            TPZRestoredInstance::~TPZRestoredInstance
                      ((TPZRestoredInstance *)
                       ((long)pTVar7[-1].mPointersVec.fExtAlloc + lVar5 + -0x30));
            lVar5 = lVar5 + -0x60;
          } while (lVar5 != 0);
        }
        operator_delete__(&pTVar7[-1].is_already_read,lVar4 * 0x60 + 8);
      }
      this->fStore = (TPZRestoredInstance *)0x0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = newsize;
      uVar6 = 0xffffffffffffffff;
      if (SUB168(auVar1 * ZEXT816(0x60),8) == 0) {
        uVar6 = SUB168(auVar1 * ZEXT816(0x60),0) | 8;
      }
      piVar3 = (int64_t *)operator_new__(uVar6);
      *piVar3 = newsize;
      lVar4 = 0;
      pTVar7 = (TPZRestoredInstance *)(piVar3 + 1);
      do {
        TPZRestoredInstance::TPZRestoredInstance(pTVar7);
        lVar4 = lVar4 + -0x60;
        pTVar7 = pTVar7 + 1;
      } while (-lVar4 != newsize * 0x60);
      lVar4 = this->fNElements;
      if (newsize <= lVar4) {
        lVar4 = newsize;
      }
      if (0 < lVar4) {
        lVar5 = 0;
        do {
          pTVar7 = this->fStore;
          *(undefined8 *)((long)piVar3 + lVar5 + 0x10) =
               *(undefined8 *)((long)(pTVar7->mPointersVec).fExtAlloc + lVar5 + -0x28);
          TPZManVector<int,_3>::operator=
                    ((TPZManVector<int,_3> *)((long)piVar3 + lVar5 + 0x18),
                     (TPZManVector<int,_3> *)
                     ((long)(pTVar7->mPointersVec).fExtAlloc + lVar5 + -0x20));
          TPZAutoPointer<TPZSavable>::operator=
                    ((TPZAutoPointer<TPZSavable> *)((long)piVar3 + lVar5 + 0x48),
                     (TPZAutoPointer<TPZSavable> *)
                     ((long)(&pTVar7->mPointersVec + 1) + 0x20 + lVar5 + -0x20));
          *(undefined8 *)((long)piVar3 + lVar5 + 0x50) =
               *(undefined8 *)
                ((long)&(((shared_ptr<TPZSavable> *)
                         ((TPZAutoPointer<TPZSavable> *)(&pTVar7->mPointersVec + 1) + 1))->
                        super___shared_ptr<TPZSavable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar5);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)piVar3 + lVar5 + 0x58),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             ((TPZAutoPointer<TPZSavable> *)(&pTVar7->mPointersVec + 1) + 2))->_M_pi
                     + lVar5));
          *(bool *)((long)piVar3 + lVar5 + 0x60) =
               *(bool *)((long)((TPZAutoPointer<TPZSavable> *)(&pTVar7->mPointersVec + 1) + 3) +
                        lVar5);
          lVar5 = lVar5 + 0x60;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      pTVar7 = this->fStore;
      if (pTVar7 != (TPZRestoredInstance *)0x0) {
        lVar4 = *(long *)&pTVar7[-1].is_already_read;
        if (lVar4 != 0) {
          lVar5 = lVar4 * 0x60;
          do {
            TPZRestoredInstance::~TPZRestoredInstance
                      ((TPZRestoredInstance *)
                       ((long)pTVar7[-1].mPointersVec.fExtAlloc + lVar5 + -0x30));
            lVar5 = lVar5 + -0x60;
          } while (lVar5 != 0);
        }
        operator_delete__(&pTVar7[-1].is_already_read,lVar4 * 0x60 + 8);
      }
      this->fStore = (TPZRestoredInstance *)(piVar3 + 1);
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}